

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceDirectional::~IfcLightSourceDirectional
          (IfcLightSourceDirectional *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x90 = 0x85f980;
  *(undefined8 *)&(this->super_IfcLightSource).Intensity.have = 0x85f9f8;
  *(undefined8 *)&this[-1].field_0xa0 = 0x85f9a8;
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x85f9d0;
  puVar1 = *(undefined1 **)
            &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10;
  puVar2 = &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
            super_IfcRepresentationItem.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  operator_delete(&this[-1].super_IfcLightSource.field_0x90,0xb0);
  return;
}

Assistant:

IfcLightSource() : Object("IfcLightSource") {}